

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O1

Lf_Cut_t * Lf_ObjCutBestNew(Lf_Man_t *p,int i,Lf_Cut_t *pCut)

{
  int iVar1;
  Lf_Bst_t *pLVar2;
  Gia_Man_t *pGVar3;
  uint *puVar4;
  Gia_Obj_t *pGVar5;
  uint uVar6;
  
  if ((i < 0) || ((p->vOffsets).nSize <= i)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  pLVar2 = p->pObjBests;
  iVar1 = (p->vOffsets).pArray[(uint)i];
  uVar6 = 0;
  if (((uint)pLVar2[iVar1].Cut[0] & 1) == 0) {
    uVar6 = 2 - ((uint)pLVar2[iVar1].Cut[1] & 1);
  }
  pCut->Delay = pLVar2[iVar1].Delay[uVar6];
  pCut->Flow = pLVar2[iVar1].Flow[uVar6];
  if (uVar6 == 2) {
    pGVar3 = p->pGia;
    if (pGVar3->nObjs <= i) {
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                    ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    puVar4 = pGVar3->pMuxes;
    if ((puVar4 == (uint *)0x0) || (puVar4[(uint)i] == 0)) {
      __assert_fail("Gia_ObjIsMux(p->pGia, pMux)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaLf.c"
                    ,0x244,"Lf_Cut_t *Lf_MemLoadMuxCut(Lf_Man_t *, int, Lf_Cut_t *)");
    }
    pGVar5 = pGVar3->pObjs;
    pCut->iFunc = -(uint)(p->pPars->fCutMin == 0) | 4;
    *(uint *)&pCut[1].Sign = i - (*(uint *)(pGVar5 + (uint)i) & 0x1fffffff);
    *(uint *)((long)&pCut[1].Sign + 4) = i - (*(uint *)&pGVar5[(uint)i].field_0x4 & 0x1fffffff);
    uVar6 = puVar4[(uint)i];
    if (uVar6 == 0) {
      uVar6 = 0xffffffff;
    }
    else {
      if ((int)uVar6 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                      ,0x10c,"int Abc_Lit2Var(int)");
      }
      uVar6 = uVar6 >> 1;
    }
    pCut[1].Delay = uVar6;
    *(uint *)&pCut->field_0x14 = *(uint *)&pCut->field_0x14 & 0x7fffff | 0x3800000;
  }
  else {
    Lf_MemLoadCut(&p->vStoreNew,(uint)pLVar2[iVar1].Cut[uVar6] >> 1,i,pCut,0,0);
  }
  return pCut;
}

Assistant:

static inline Lf_Cut_t * Lf_ObjCutBestNew( Lf_Man_t * p, int i, Lf_Cut_t * pCut )
{
    Lf_Bst_t * pBest = Lf_ObjReadBest( p, i );
    int Index = Lf_BestCutIndex( pBest );
    pCut->Delay = pBest->Delay[Index];
    pCut->Flow  = pBest->Flow[Index];
    if ( Index == 2 )
        return Lf_MemLoadMuxCut( p, i, pCut );
    return Lf_MemLoadCut( &p->vStoreNew, pBest->Cut[Index].Handle, i, pCut, 0, 0 );
}